

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.h
# Opt level: O0

void assert_dbl_array_near(double *exp,double *real,size_t n,double tol,char *caller,int line)

{
  ulong local_40;
  size_t i;
  int line_local;
  char *caller_local;
  double tol_local;
  size_t n_local;
  double *real_local;
  double *exp_local;
  
  for (local_40 = 0; local_40 < n; local_40 = local_40 + 1) {
    assert_dbl_near(exp[local_40],real[local_40],tol,caller,line);
  }
  return;
}

Assistant:

inline static void assert_dbl_array_near(double *exp, double *real, size_t n, double tol, char const *caller, int line)
{
  for (size_t i = 0; i < n; ++i)
  {
    assert_dbl_near(exp[i], real[i], tol, caller, line);
  }
}